

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cc
# Opt level: O2

void __thiscall AVO::Agent::Agent(Agent *this)

{
  Vector2::Vector2(&this->newVelocity_);
  Vector2::Vector2(&this->position_);
  Vector2::Vector2(&this->prefVelocity_);
  Vector2::Vector2(&this->velocity_);
  this->accelInterval_ = 0.0;
  this->maxAccel_ = 0.0;
  this->maxSpeed_ = 0.0;
  this->neighborDist_ = 0.0;
  this->id_ = 0;
  this->maxNeighbors_ = 0;
  this->radius_ = 0.0;
  this->timeHorizon_ = 0.0;
  std::_Deque_base<AVO::Vector2,_std::allocator<AVO::Vector2>_>::_Deque_base
            (&(this->boundary_).super__Deque_base<AVO::Vector2,_std::allocator<AVO::Vector2>_>);
  (this->orcaLines_).super__Vector_base<AVO::Line,_std::allocator<AVO::Line>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->orcaLines_).super__Vector_base<AVO::Line,_std::allocator<AVO::Line>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->agentNeighbors_).
  super__Vector_base<std::pair<float,_const_AVO::Agent_*>,_std::allocator<std::pair<float,_const_AVO::Agent_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->orcaLines_).super__Vector_base<AVO::Line,_std::allocator<AVO::Line>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->agentNeighbors_).
  super__Vector_base<std::pair<float,_const_AVO::Agent_*>,_std::allocator<std::pair<float,_const_AVO::Agent_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->agentNeighbors_).
  super__Vector_base<std::pair<float,_const_AVO::Agent_*>,_std::allocator<std::pair<float,_const_AVO::Agent_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

Agent::Agent()
    : id_(0U),
      maxNeighbors_(0U),
      accelInterval_(0.0F),
      maxAccel_(0.0F),
      maxSpeed_(0.0F),
      neighborDist_(0.0F),
      radius_(0.0F),
      timeHorizon_(0.0F) {}